

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O1

void __thiscall Refal2::CLeftPartCompiler::matchVE(CLeftPartCompiler *this,bool isRightDirection)

{
  int iVar1;
  int iVar2;
  CVariable *pCVar3;
  bool bVar4;
  undefined7 in_register_00000031;
  long lVar5;
  
  checkBorders(this);
  iVar1 = (this->super_CFunctionCompilerBase).variables.variablesSize;
  if ((int)CONCAT71(in_register_00000031,isRightDirection) == 0) {
    iVar2 = (((this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first)->
            super_CUnit).field_1.variable;
    lVar5 = (long)iVar2;
    if ((-1 < lVar5) && (iVar2 < iVar1)) {
      pCVar3 = (this->super_CFunctionCompilerBase).variables.variables;
      iVar1 = (this->super_CFunctionCompilerBase).variables.variablesSize;
      if (pCVar3[lVar5].type == VT_E) {
        if (iVar2 < iVar1) {
          bVar4 = setVariable(this,iVar2);
          COperationsBuilder::AddMatchLeft_E
                    ((COperationsBuilder *)this,&pCVar3[lVar5].qualifier,bVar4);
LAB_0011fe9e:
          CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this->hole);
          return;
        }
      }
      else if (iVar2 < iVar1) {
        bVar4 = setVariable(this,iVar2);
        COperationsBuilder::AddMatchLeft_V
                  ((COperationsBuilder *)this,&pCVar3[lVar5].qualifier,bVar4);
        goto LAB_0011fe9e;
      }
    }
  }
  else {
    iVar2 = (((this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last)->
            super_CUnit).field_1.variable;
    lVar5 = (long)iVar2;
    if ((-1 < lVar5) && (iVar2 < iVar1)) {
      pCVar3 = (this->super_CFunctionCompilerBase).variables.variables;
      iVar1 = (this->super_CFunctionCompilerBase).variables.variablesSize;
      if (pCVar3[lVar5].type == VT_E) {
        if (iVar1 <= iVar2) goto LAB_0011feab;
        bVar4 = setVariable(this,iVar2);
        COperationsBuilder::AddMatchRight_E
                  ((COperationsBuilder *)this,&pCVar3[lVar5].qualifier,bVar4);
      }
      else {
        if (iVar1 <= iVar2) goto LAB_0011feab;
        bVar4 = setVariable(this,iVar2);
        COperationsBuilder::AddMatchRight_V
                  ((COperationsBuilder *)this,&pCVar3[lVar5].qualifier,bVar4);
      }
      CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
      return;
    }
  }
LAB_0011feab:
  __assert_fail("IsValidVariableIndex( variableIndex )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Variables.h"
                ,0x75,"CVariable &Refal2::CVariables::GetVariable(TVariableIndex)");
}

Assistant:

void CLeftPartCompiler::matchVE(const bool isRightDirection)
{
	checkBorders();
	if( isRightDirection ) {
		TVariableIndex variableIndex = hole->GetLast()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchRight_V );
		}

		hole->RemoveLast();
	} else {
		TVariableIndex variableIndex = hole->GetFirst()->Variable();

		if( variables.GetVariable( variableIndex ).TypeIs( VT_E ) ) {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_E );
		} else {
			matchVariable( variableIndex,
				&COperationsBuilder::AddMatchLeft_V );
		}

		hole->RemoveFirst();
	}
}